

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vAnds)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  
  iVar3 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar3 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar5 = (uint)*(undefined8 *)pObj;
  if (((int)uVar5 < 0) || (uVar5 = uVar5 & 0x1fffffff, uVar5 == 0x1fffffff)) {
    __assert_fail("Gia_ObjIsAnd(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x35c,"void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)"
                 );
  }
  if (((~*(uint *)(pObj + -(ulong)uVar5) & 0x1fffffff) != 0 &&
       -1 < (int)*(uint *)(pObj + -(ulong)uVar5)) &&
     (uVar4 = (ulong)((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff),
     -1 < (int)*(uint *)(pObj + -uVar4) && (~*(uint *)(pObj + -uVar4) & 0x1fffffff) != 0)) {
    uVar1 = pObj[-uVar4].Value;
    uVar2 = pObj[-(ulong)uVar5].Value;
    if (uVar2 == uVar1) {
      __assert_fail("Gia_ObjFanin0(pObj)->Value != Gia_ObjFanin1(pObj)->Value",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                    ,0x364,
                    "void Gia_ManFindCaninicalOrder_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    if (uVar1 <= uVar2) {
      Gia_ManFindCaninicalOrder_rec(p,pObj + -uVar4,vAnds);
      uVar5 = (uint)*(undefined8 *)pObj;
      goto LAB_005df690;
    }
  }
  Gia_ManFindCaninicalOrder_rec(p,pObj + -(ulong)uVar5,vAnds);
  uVar5 = *(uint *)&pObj->field_0x4;
LAB_005df690:
  Gia_ManFindCaninicalOrder_rec(p,pObj + -(ulong)(uVar5 & 0x1fffffff),vAnds);
  iVar3 = Gia_ObjId(p,pObj);
  Vec_IntPush(vAnds,iVar3);
  return;
}

Assistant:

void Gia_ManFindCaninicalOrder_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vAnds )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( !Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) || !Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
    {
        Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
        Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
    }
    else
    {
        assert( Gia_ObjFanin0(pObj)->Value != Gia_ObjFanin1(pObj)->Value );
        if ( Gia_ObjFanin0(pObj)->Value < Gia_ObjFanin1(pObj)->Value )
        {
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
        }
        else
        {
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin1(pObj), vAnds );
            Gia_ManFindCaninicalOrder_rec( p, Gia_ObjFanin0(pObj), vAnds );
        }
    }
    Vec_IntPush( vAnds, Gia_ObjId(p, pObj) );
}